

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
Line::generate_option
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,Line *this,
          vector<int,_std::allocator<int>_> *position_indexes,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *possible_per_number)

{
  pointer piVar1;
  pointer pvVar2;
  pointer piVar3;
  int iVar4;
  _Bvector_impl *p_Var5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  allocator_type local_5a;
  bool local_59;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_59 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)this->m_size,&local_59,&local_5a);
  piVar1 = (this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)(this->m_numbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 2;
    pvVar2 = (possible_per_number->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    piVar3 = (position_indexes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 0;
    do {
      lVar10 = (long)piVar1[lVar9];
      if (0 < lVar10) {
        uVar6 = (ulong)*(int *)(*(long *)&pvVar2[lVar9].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + (long)piVar3[lVar9] * 4);
        do {
          iVar4 = (int)uVar6;
          iVar8 = iVar4 + 0x3f;
          if (-1 < iVar4) {
            iVar8 = iVar4;
          }
          local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [(long)(iVar8 >> 6) + ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [(long)(iVar8 >> 6) +
                ((ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)uVar6 & 0x3f);
          uVar6 = uVar6 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar7 + (ulong)(lVar7 == 0));
  }
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_end_of_storage =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  p_Var5 = &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  p_Var5 = &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  (p_Var5->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var5->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc =
       local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._12_4_;
  return __return_storage_ptr__;
}

Assistant:

vector<bool>
Line::generate_option(const vector<int> &position_indexes, const vector<vector<int>> &possible_per_number) const {
    vector<bool> option(m_size, false);

    for (int i = 0; i < m_numbers.size(); i++) {
        for (int j = 0; j < m_numbers[i]; j++) option[possible_per_number[i][position_indexes[i]] + j] = true;
    }

#if DEBUG_TRACES
    Logger logger(TRACE);
    auto &output = logger.get();
    for (auto &&tile : option) {
        output << (tile ? '1' : '0');
    }
    output << endl;
    logger.flush();
#endif //DEBUG_TRACES

    return move(option);
}